

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Builder::sortObjectIndexLong
          (Builder *this,uint8_t *objBase,iterator indexStart,iterator indexEnd)

{
  long *plVar1;
  default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
  *this_00;
  void *__src;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *__src_00;
  long *plVar4;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *p_Var5;
  pointer pSVar6;
  uint8_t *puVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_> *__ptr
  ;
  __normal_iterator<(anonymous_namespace)::SortEntry_*,_std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
  __i;
  long lVar13;
  size_t __n;
  _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
  *p_Var14;
  long *in_FS_OFFSET;
  SortEntry e;
  uint64_t uStack_48;
  unsigned_long local_40;
  long local_38;
  
  __ptr = (vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
           *)objBase;
  __tls_init();
  plVar1 = (long *)(*in_FS_OFFSET + -0x18);
  __tls_init();
  if (*plVar1 == 0) {
    plVar4 = (long *)operator_new(0x18);
    *plVar4 = 0;
    plVar4[1] = 0;
    plVar4[2] = 0;
    __tls_init();
    this_00 = (default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
               *)*plVar1;
    *plVar1 = (long)plVar4;
    if (this_00 !=
        (default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
         *)0x0) {
      std::
      default_delete<std::vector<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>_>
      ::operator()(this_00,__ptr);
      plVar4 = (long *)*plVar1;
    }
  }
  else {
    __tls_init();
    plVar4 = (long *)*plVar1;
    if (plVar4[1] != *plVar4) {
      plVar4[1] = *plVar4;
    }
  }
  p_Var5 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
            *)((long)indexEnd._M_current - (long)indexStart._M_current >> 3);
  p_Var14 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
             *)0x20;
  if ((_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
       *)0x20 < p_Var5) {
    p_Var14 = p_Var5;
  }
  if (p_Var5 < (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                *)0x555555555555556) {
    lVar11 = *plVar4;
    if ((_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
         *)((plVar4[2] - lVar11 >> 3) * -0x5555555555555555) < p_Var14) {
      lVar12 = plVar4[1];
      pSVar6 = std::
               _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
               ::_M_allocate(p_Var14,(size_t)__ptr);
      __src = (void *)*plVar4;
      if (0 < plVar4[1] - (long)__src) {
        memmove(pSVar6,__src,plVar4[1] - (long)__src);
      }
      if (__src != (void *)0x0) {
        operator_delete(__src,plVar4[2] - (long)__src);
      }
      *plVar4 = (long)pSVar6;
      plVar4[1] = (lVar12 - lVar11) + (long)pSVar6;
      plVar4[2] = (long)(pSVar6 + (long)p_Var14);
    }
    if (indexEnd._M_current != indexStart._M_current) {
      lVar11 = (long)&(p_Var5->_M_impl).super__Vector_impl_data._M_start +
               (ulong)(p_Var5 ==
                      (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                       *)0x0);
      lVar12 = 0;
      local_38 = lVar11;
      do {
        local_40 = indexStart._M_current[lVar12];
        puVar7 = anon_unknown.dwarf_1f297::findAttrName(objBase + local_40,&uStack_48);
        puVar2 = (undefined8 *)*plVar1;
        puVar3 = (undefined8 *)puVar2[1];
        if (puVar3 == (undefined8 *)puVar2[2]) {
          __src_00 = (undefined8 *)*puVar2;
          __n = (long)puVar3 - (long)__src_00;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar10 = ((long)__n >> 3) * -0x5555555555555555;
          uVar8 = uVar10;
          if (puVar3 == __src_00) {
            uVar8 = 1;
          }
          p_Var14 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                     *)(uVar8 + uVar10);
          if ((_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
               *)0x555555555555554 < p_Var14) {
            p_Var14 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                       *)0x555555555555555;
          }
          if (CARRY8(uVar8,uVar10)) {
            p_Var14 = (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                       *)0x555555555555555;
          }
          pSVar6 = std::
                   _Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                   ::_M_allocate(p_Var14,1);
          *(undefined8 *)((long)pSVar6 + __n) = puVar7;
          ((undefined8 *)((long)pSVar6 + __n))[1] = uStack_48;
          *(unsigned_long *)((long)pSVar6 + __n + 0x10) = local_40;
          if (0 < (long)__n) {
            memmove(pSVar6,__src_00,__n);
          }
          if (__src_00 != (undefined8 *)0x0) {
            operator_delete(__src_00,puVar2[2] - (long)__src_00);
          }
          *puVar2 = pSVar6;
          puVar2[1] = (long)pSVar6 + __n + 0x18;
          puVar2[2] = pSVar6 + (long)p_Var14;
          lVar11 = local_38;
        }
        else {
          puVar3[2] = local_40;
          *puVar3 = puVar7;
          puVar3[1] = uStack_48;
          puVar2[1] = puVar2[1] + 0x18;
        }
        lVar12 = lVar12 + 1;
      } while (lVar11 != lVar12);
    }
    lVar11 = *(long *)*plVar1;
    lVar12 = ((long *)*plVar1)[1];
    if (lVar11 != lVar12) {
      uVar8 = (lVar12 - lVar11 >> 3) * -0x5555555555555555;
      lVar13 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                (lVar11,lVar12,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 - lVar11 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                  (lVar11,lVar12);
      }
      else {
        lVar13 = lVar11 + 0x180;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                  (lVar11,lVar13);
        for (; lVar13 != lVar12; lVar13 = lVar13 + 0x18) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::SortEntry*,std::vector<(anonymous_namespace)::SortEntry,std::allocator<(anonymous_namespace)::SortEntry>>>,__gnu_cxx::__ops::_Val_comp_iter<arangodb::velocypack::Builder::sortObjectIndexLong(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>>
                    (lVar13);
        }
      }
    }
    if (indexEnd._M_current != indexStart._M_current) {
      puVar9 = (unsigned_long *)(*(long *)*plVar1 + 0x10);
      lVar11 = 0;
      do {
        indexStart._M_current[lVar11] = *puVar9;
        lVar11 = lVar11 + 1;
        puVar9 = puVar9 + 3;
      } while ((long)&(p_Var5->_M_impl).super__Vector_impl_data._M_start +
               (ulong)(p_Var5 ==
                      (_Vector_base<(anonymous_namespace)::SortEntry,_std::allocator<(anonymous_namespace)::SortEntry>_>
                       *)0x0) != lVar11);
    }
    return;
  }
  std::__throw_length_error("vector::reserve");
}

Assistant:

void Builder::sortObjectIndexLong(
    uint8_t* objBase, std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) const {
#ifndef VELOCYPACK_NO_THREADLOCALS
  std::unique_ptr<std::vector<SortEntry>>& tmp = ::sortEntries;

  // start with clean sheet in case the previous run left something
  // in the vector (e.g. when bailing out with an exception)
  if (::sortEntries == nullptr) {
    ::sortEntries = std::make_unique<std::vector<SortEntry>>();
  } else {
    ::sortEntries->clear();
  }
#else
  auto tmp = std::make_unique<std::vector<SortEntry>>();
#endif

  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 1);
  tmp->reserve(std::max(::minSortEntriesAllocation, n));
  for (std::size_t i = 0; i < n; i++) {
    SortEntry e;
    e.offset = indexStart[i];
    e.nameStart = ::findAttrName(objBase + e.offset, e.nameSize);
    tmp->push_back(e);
  }
  VELOCYPACK_ASSERT(tmp->size() == n);
  std::sort(tmp->begin(), tmp->end(),
            [](SortEntry const& a, SortEntry const& b)
#ifdef VELOCYPACK_64BIT
                noexcept
#endif
            {
              // return true iff a < b:
              uint64_t sizea = a.nameSize;
              uint64_t sizeb = b.nameSize;
              std::size_t const compareLength =
                  checkOverflow((std::min)(sizea, sizeb));
              int res = std::memcmp(a.nameStart, b.nameStart, compareLength);

              return (res < 0 || (res == 0 && sizea < sizeb));
            });

  // copy back the sorted offsets
  for (std::size_t i = 0; i < n; i++) {
    indexStart[i] = (*tmp)[i].offset;
  }
}